

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTestsUtil.cpp
# Opt level: O0

deUint32 vkt::pipeline::multisample::getDimensions(ImageType imageType)

{
  ImageType imageType_local;
  
  if (imageType != IMAGE_TYPE_1D) {
    if (imageType - IMAGE_TYPE_1D_ARRAY < 2) {
      return 2;
    }
    if (imageType - IMAGE_TYPE_2D_ARRAY < 4) {
      return 3;
    }
    if (imageType != IMAGE_TYPE_BUFFER) {
      return 0;
    }
  }
  return 1;
}

Assistant:

deUint32 getDimensions (const ImageType imageType)
{
	switch (imageType)
	{
	case IMAGE_TYPE_1D:
	case IMAGE_TYPE_BUFFER:
		return 1u;

	case IMAGE_TYPE_1D_ARRAY:
	case IMAGE_TYPE_2D:
		return 2u;

	case IMAGE_TYPE_2D_ARRAY:
	case IMAGE_TYPE_CUBE:
	case IMAGE_TYPE_CUBE_ARRAY:
	case IMAGE_TYPE_3D:
		return 3u;

	default:
		DE_FATAL("Unknown image type");
		return 0u;
	}
}